

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc_sse2.c
# Opt level: O0

float CombinedShannonEntropy_SSE2(int *X,int *Y)

{
  ushort uVar1;
  float fVar2;
  int iVar3;
  long in_RSI;
  long in_RDI;
  float fVar4;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int x;
  int xy;
  int32_t j;
  int32_t my;
  int32_t mx;
  __m128i y4;
  __m128i x4;
  __m128i y3;
  __m128i x3;
  __m128i y2;
  __m128i x2;
  __m128i y1;
  __m128i x1;
  __m128i y0;
  __m128i x0;
  __m128i zero;
  int sumXY;
  int sumX;
  double retval;
  int i;
  undefined4 local_260;
  undefined4 local_18c;
  undefined1 local_38;
  undefined1 uStack_37;
  undefined1 uStack_36;
  undefined1 uStack_35;
  undefined1 uStack_34;
  undefined1 uStack_33;
  undefined1 uStack_32;
  undefined1 uStack_31;
  undefined1 uStack_30;
  undefined1 uStack_2f;
  undefined1 uStack_2e;
  undefined1 uStack_2d;
  undefined1 uStack_2c;
  undefined1 uStack_2b;
  undefined1 uStack_2a;
  undefined1 uStack_29;
  undefined1 local_18;
  undefined1 uStack_17;
  undefined1 uStack_16;
  undefined1 uStack_15;
  undefined1 uStack_14;
  undefined1 uStack_13;
  undefined1 uStack_12;
  undefined1 uStack_11;
  undefined1 uStack_10;
  undefined1 uStack_f;
  undefined1 uStack_e;
  undefined1 uStack_d;
  undefined1 uStack_c;
  undefined1 uStack_b;
  undefined1 uStack_a;
  undefined1 uStack_9;
  
  fVar2 = 0.0;
  for (local_18c = 0; local_18c < 0x100; local_18c = local_18c + 0x10) {
    auVar7 = packssdw(*(undefined1 (*) [16])(in_RDI + (long)local_18c * 4),
                      *(undefined1 (*) [16])(in_RDI + 0x10 + (long)local_18c * 4));
    auVar6 = packssdw(*(undefined1 (*) [16])(in_RDI + 0x20 + (long)local_18c * 4),
                      *(undefined1 (*) [16])(in_RDI + 0x30 + (long)local_18c * 4));
    auVar6 = packsswb(auVar7,auVar6);
    auVar8 = packssdw(*(undefined1 (*) [16])(in_RSI + (long)local_18c * 4),
                      *(undefined1 (*) [16])(in_RSI + 0x10 + (long)local_18c * 4));
    auVar7 = packssdw(*(undefined1 (*) [16])(in_RSI + 0x20 + (long)local_18c * 4),
                      *(undefined1 (*) [16])(in_RSI + 0x30 + (long)local_18c * 4));
    auVar8 = packsswb(auVar8,auVar7);
    local_18 = auVar6[0];
    uStack_17 = auVar6[1];
    uStack_16 = auVar6[2];
    uStack_15 = auVar6[3];
    uStack_14 = auVar6[4];
    uStack_13 = auVar6[5];
    uStack_12 = auVar6[6];
    uStack_11 = auVar6[7];
    uStack_10 = auVar6[8];
    uStack_f = auVar6[9];
    uStack_e = auVar6[10];
    uStack_d = auVar6[0xb];
    uStack_c = auVar6[0xc];
    uStack_b = auVar6[0xd];
    uStack_a = auVar6[0xe];
    uStack_9 = auVar6[0xf];
    auVar7[1] = -('\0' < uStack_17);
    auVar7[0] = -('\0' < local_18);
    auVar7[2] = -('\0' < uStack_16);
    auVar7[3] = -('\0' < uStack_15);
    auVar7[4] = -('\0' < uStack_14);
    auVar7[5] = -('\0' < uStack_13);
    auVar7[6] = -('\0' < uStack_12);
    auVar7[7] = -('\0' < uStack_11);
    auVar7[8] = -('\0' < uStack_10);
    auVar7[9] = -('\0' < uStack_f);
    auVar7[10] = -('\0' < uStack_e);
    auVar7[0xb] = -('\0' < uStack_d);
    auVar7[0xc] = -('\0' < uStack_c);
    auVar7[0xd] = -('\0' < uStack_b);
    auVar7[0xe] = -('\0' < uStack_a);
    auVar7[0xf] = -('\0' < uStack_9);
    uVar1 = (ushort)(SUB161(auVar7 >> 7,0) & 1) | (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar7 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar7 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar7 >> 0x77,0) & 1) << 0xe |
            (ushort)((byte)-('\0' < uStack_9) >> 7) << 0xf;
    local_38 = auVar8[0];
    uStack_37 = auVar8[1];
    uStack_36 = auVar8[2];
    uStack_35 = auVar8[3];
    uStack_34 = auVar8[4];
    uStack_33 = auVar8[5];
    uStack_32 = auVar8[6];
    uStack_31 = auVar8[7];
    uStack_30 = auVar8[8];
    uStack_2f = auVar8[9];
    uStack_2e = auVar8[10];
    uStack_2d = auVar8[0xb];
    uStack_2c = auVar8[0xc];
    uStack_2b = auVar8[0xd];
    uStack_2a = auVar8[0xe];
    uStack_29 = auVar8[0xf];
    auVar6[1] = -('\0' < uStack_37);
    auVar6[0] = -('\0' < local_38);
    auVar6[2] = -('\0' < uStack_36);
    auVar6[3] = -('\0' < uStack_35);
    auVar6[4] = -('\0' < uStack_34);
    auVar6[5] = -('\0' < uStack_33);
    auVar6[6] = -('\0' < uStack_32);
    auVar6[7] = -('\0' < uStack_31);
    auVar6[8] = -('\0' < uStack_30);
    auVar6[9] = -('\0' < uStack_2f);
    auVar6[10] = -('\0' < uStack_2e);
    auVar6[0xb] = -('\0' < uStack_2d);
    auVar6[0xc] = -('\0' < uStack_2c);
    auVar6[0xd] = -('\0' < uStack_2b);
    auVar6[0xe] = -('\0' < uStack_2a);
    auVar6[0xf] = -('\0' < uStack_29);
    for (local_260 = (uint)(ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) |
                                    (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                                    (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
                                    (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
                                    (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
                                    (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
                                    (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
                                    (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
                                    (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
                                    (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
                                    (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
                                    (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
                                    (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
                                    (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
                                    (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe |
                                    (ushort)((byte)-('\0' < uStack_29) >> 7) << 0xf | uVar1);
        local_260 != 0; local_260 = local_260 - 1 & local_260) {
      iVar3 = BitsCtz(local_260);
      if (((int)(uint)uVar1 >> ((byte)iVar3 & 0x1f) & 1U) != 0) {
        fVar4 = VP8LFastSLog2(0);
        fVar2 = fVar2 - fVar4;
      }
      fVar4 = VP8LFastSLog2(0);
      fVar2 = fVar2 - fVar4;
    }
  }
  fVar4 = VP8LFastSLog2(0);
  fVar5 = VP8LFastSLog2(0);
  return fVar4 + fVar5 + fVar2;
}

Assistant:

static float CombinedShannonEntropy_SSE2(const int X[256], const int Y[256]) {
  int i;
  double retval = 0.;
  int sumX = 0, sumXY = 0;
  const __m128i zero = _mm_setzero_si128();

  for (i = 0; i < 256; i += 16) {
    const __m128i x0 = _mm_loadu_si128((const __m128i*)(X + i +  0));
    const __m128i y0 = _mm_loadu_si128((const __m128i*)(Y + i +  0));
    const __m128i x1 = _mm_loadu_si128((const __m128i*)(X + i +  4));
    const __m128i y1 = _mm_loadu_si128((const __m128i*)(Y + i +  4));
    const __m128i x2 = _mm_loadu_si128((const __m128i*)(X + i +  8));
    const __m128i y2 = _mm_loadu_si128((const __m128i*)(Y + i +  8));
    const __m128i x3 = _mm_loadu_si128((const __m128i*)(X + i + 12));
    const __m128i y3 = _mm_loadu_si128((const __m128i*)(Y + i + 12));
    const __m128i x4 = _mm_packs_epi16(_mm_packs_epi32(x0, x1),
                                       _mm_packs_epi32(x2, x3));
    const __m128i y4 = _mm_packs_epi16(_mm_packs_epi32(y0, y1),
                                       _mm_packs_epi32(y2, y3));
    const int32_t mx = _mm_movemask_epi8(_mm_cmpgt_epi8(x4, zero));
    int32_t my = _mm_movemask_epi8(_mm_cmpgt_epi8(y4, zero)) | mx;
    while (my) {
      const int32_t j = BitsCtz(my);
      int xy;
      if ((mx >> j) & 1) {
        const int x = X[i + j];
        sumXY += x;
        retval -= VP8LFastSLog2(x);
      }
      xy = X[i + j] + Y[i + j];
      sumX += xy;
      retval -= VP8LFastSLog2(xy);
      my &= my - 1;
    }
  }
  retval += VP8LFastSLog2(sumX) + VP8LFastSLog2(sumXY);
  return (float)retval;
}